

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::SetWindingCount(Clipper *this,TEdge *edge)

{
  PolyType PVar1;
  uint uVar2;
  int iVar3;
  TEdge *pTVar4;
  byte bVar5;
  uint uVar6;
  TEdge *pTVar7;
  uint uVar8;
  
  pTVar4 = edge->PrevInAEL;
  if (pTVar4 != (TEdge *)0x0) {
    PVar1 = edge->PolyTyp;
    do {
      if ((pTVar4->PolyTyp == PVar1) && (iVar3 = pTVar4->WindDelta, iVar3 != 0)) {
        uVar6 = edge->WindDelta;
        if ((uVar6 == 0) && (this->m_ClipType != ctUnion)) {
          edge->WindCnt = 1;
        }
        else if ((&this->m_ClipFillType)[PVar1 == ptSubject] == pftEvenOdd) {
          if (uVar6 == 0) {
            pTVar7 = pTVar4->PrevInAEL;
            if (pTVar7 == (TEdge *)0x0) {
              uVar6 = 0;
            }
            else {
              bVar5 = 1;
              do {
                if (pTVar7->PolyTyp == PVar1) {
                  bVar5 = bVar5 ^ pTVar7->WindDelta != 0;
                }
                pTVar7 = pTVar7->PrevInAEL;
              } while (pTVar7 != (TEdge *)0x0);
              uVar6 = (uint)(~bVar5 & 1);
            }
          }
          edge->WindCnt = uVar6;
        }
        else {
          uVar2 = pTVar4->WindCnt;
          if ((int)(uVar2 * iVar3) < 0) {
            uVar8 = -uVar2;
            if (0 < (int)uVar2) {
              uVar8 = uVar2;
            }
            if (1 < uVar8) goto LAB_00292174;
            iVar3 = uVar6 + (uVar6 == 0);
          }
          else if (uVar6 == 0) {
            iVar3 = uVar2 + ((int)uVar2 >> 0x1f | 1U);
          }
          else {
LAB_00292174:
            uVar8 = 0;
            if (-1 < (int)(iVar3 * uVar6)) {
              uVar8 = uVar6;
            }
            iVar3 = uVar2 + uVar8;
          }
          edge->WindCnt = iVar3;
        }
        uVar6 = pTVar4->WindCnt2;
        edge->WindCnt2 = uVar6;
        goto LAB_002921a1;
      }
      pTVar4 = pTVar4->PrevInAEL;
    } while (pTVar4 != (TEdge *)0x0);
  }
  PVar1 = edge->PolyTyp;
  iVar3 = edge->WindDelta;
  if (iVar3 == 0) {
    iVar3 = (uint)((&this->m_ClipFillType)[PVar1 == ptSubject] != pftNegative) * 2 + -1;
  }
  edge->WindCnt = iVar3;
  edge->WindCnt2 = 0;
  pTVar4 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
  uVar6 = 0;
LAB_002921a1:
  pTVar4 = pTVar4->NextInAEL;
  if ((&this->m_ClipFillType)[PVar1 != ptSubject] == pftEvenOdd) {
    for (; pTVar4 != edge; pTVar4 = pTVar4->NextInAEL) {
      if (pTVar4->WindDelta != 0) {
        uVar6 = (uint)(uVar6 == 0);
        edge->WindCnt2 = uVar6;
      }
    }
  }
  else if (pTVar4 != edge) {
    do {
      uVar6 = uVar6 + pTVar4->WindDelta;
      pTVar4 = pTVar4->NextInAEL;
    } while (pTVar4 != edge);
    edge->WindCnt2 = uVar6;
    return;
  }
  return;
}

Assistant:

void Clipper::SetWindingCount(TEdge &edge)
{
  TEdge *e = edge.PrevInAEL;
  //find the edge of the same polytype that immediately preceeds 'edge' in AEL
  while (e  && ((e->PolyTyp != edge.PolyTyp) || (e->WindDelta == 0))) e = e->PrevInAEL;
  if (!e)
  {
    if (edge.WindDelta == 0)
    {
      PolyFillType pft = (edge.PolyTyp == ptSubject ? m_SubjFillType : m_ClipFillType);
      edge.WindCnt = (pft == pftNegative ? -1 : 1);
    }
    else
      edge.WindCnt = edge.WindDelta;
    edge.WindCnt2 = 0;
    e = m_ActiveEdges; //ie get ready to calc WindCnt2
  }   
  else if (edge.WindDelta == 0 && m_ClipType != ctUnion)
  {
    edge.WindCnt = 1;
    edge.WindCnt2 = e->WindCnt2;
    e = e->NextInAEL; //ie get ready to calc WindCnt2
  }
  else if (IsEvenOddFillType(edge))
  {
    //EvenOdd filling ...
    if (edge.WindDelta == 0)
    {
      //are we inside a subj polygon ...
      bool Inside = true;
      TEdge *e2 = e->PrevInAEL;
      while (e2)
      {
        if (e2->PolyTyp == e->PolyTyp && e2->WindDelta != 0) 
          Inside = !Inside;
        e2 = e2->PrevInAEL;
      }
      edge.WindCnt = (Inside ? 0 : 1);
    }
    else
    {
      edge.WindCnt = edge.WindDelta;
    }
    edge.WindCnt2 = e->WindCnt2;
    e = e->NextInAEL; //ie get ready to calc WindCnt2
  } 
  else
  {
    //nonZero, Positive or Negative filling ...
    if (e->WindCnt * e->WindDelta < 0)
    {
      //prev edge is 'decreasing' WindCount (WC) toward zero
      //so we're outside the previous polygon ...
      if (Abs(e->WindCnt) > 1)
      {
        //outside prev poly but still inside another.
        //when reversing direction of prev poly use the same WC 
        if (e->WindDelta * edge.WindDelta < 0) edge.WindCnt = e->WindCnt;
        //otherwise continue to 'decrease' WC ...
        else edge.WindCnt = e->WindCnt + edge.WindDelta;
      } 
      else
        //now outside all polys of same polytype so set own WC ...
        edge.WindCnt = (edge.WindDelta == 0 ? 1 : edge.WindDelta);
    } else
    {
      //prev edge is 'increasing' WindCount (WC) away from zero
      //so we're inside the previous polygon ...
      if (edge.WindDelta == 0) 
        edge.WindCnt = (e->WindCnt < 0 ? e->WindCnt - 1 : e->WindCnt + 1);
      //if wind direction is reversing prev then use same WC
      else if (e->WindDelta * edge.WindDelta < 0) edge.WindCnt = e->WindCnt;
      //otherwise add to WC ...
      else edge.WindCnt = e->WindCnt + edge.WindDelta;
    }
    edge.WindCnt2 = e->WindCnt2;
    e = e->NextInAEL; //ie get ready to calc WindCnt2
  }

  //update WindCnt2 ...
  if (IsEvenOddAltFillType(edge))
  {
    //EvenOdd filling ...
    while (e != &edge)
    {
      if (e->WindDelta != 0)
        edge.WindCnt2 = (edge.WindCnt2 == 0 ? 1 : 0);
      e = e->NextInAEL;
    }
  } else
  {
    //nonZero, Positive or Negative filling ...
    while ( e != &edge )
    {
      edge.WindCnt2 += e->WindDelta;
      e = e->NextInAEL;
    }
  }
}